

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

KeyValue *
google::protobuf::Arena::CreateArray<google::protobuf::internal::ExtensionSet::KeyValue>
          (Arena *arena,size_t num_elements)

{
  LogMessage *pLVar1;
  KeyValue *pKVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (num_elements >> 0x3b != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
               ,0x14c);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"Requested size is too large to fit into size_t.");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (arena == (Arena *)0x0) {
    pKVar2 = (KeyValue *)operator_new__(num_elements << 5);
  }
  else {
    pKVar2 = CreateInternalRawArray<google::protobuf::internal::ExtensionSet::KeyValue>
                       (arena,num_elements);
  }
  return pKVar2;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateArray(Arena* arena,
                                               size_t num_elements) {
    static_assert(std::is_trivial<T>::value,
                  "CreateArray requires a trivially constructible type");
    static_assert(std::is_trivially_destructible<T>::value,
                  "CreateArray requires a trivially destructible type");
    GOOGLE_CHECK_LE(num_elements, std::numeric_limits<size_t>::max() / sizeof(T))
        << "Requested size is too large to fit into size_t.";
    if (arena == NULL) {
      return static_cast<T*>(::operator new[](num_elements * sizeof(T)));
    } else {
      return arena->CreateInternalRawArray<T>(num_elements);
    }
  }